

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O1

void printModel(char *filename)

{
  size_t __size;
  bool bVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  FILE *__s;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  __s = fopen(filename,"w");
  if (__s != (FILE *)0x0) {
    fwrite("c Satisfiability model produced by sgen4\n",0x29,1,__s);
    fprintf(__s,"c %s\n",commandLine);
    fwrite("s SATISFIABLE\n",0xe,1,__s);
    if (0 < numOfVariables) {
      uVar7 = 1;
      lVar9 = 0;
      do {
        iVar4 = (int)(uVar7 / 0x14);
        if ((int)lVar9 == iVar4 * 0x14) {
          fwrite("v ",2,1,__s);
        }
        fprintf(__s,"%d ",(ulong)(uint)(model[lVar9 + 1] * globalPermute[lVar9 + 1]));
        if (iVar4 * -0x14 + (int)lVar9 == -1) {
          fputc(10,__s);
        }
        lVar9 = lVar9 + 1;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (lVar9 < numOfVariables);
    }
    if ((numOfVariables * -0x33333333 + 0x19999998U >> 2 | numOfVariables * 0x40000000) < 0xccccccd)
    {
      fwrite("v ",2,1,__s);
    }
    fwrite("0 \n",3,1,__s);
    fclose(__s);
    return;
  }
  printModel_cold_1();
  initModel(numOfVariables);
  __size = (long)numOfVariables * 4 + 4;
  permute = (int *)malloc(__size);
  unpermute = (int *)malloc(__size);
  groupSize = 5;
  initGlobalPermute();
  piVar3 = permute;
  if (0 < numOfVariables) {
    lVar9 = 1;
    do {
      piVar3[lVar9] = (int)lVar9;
      bVar1 = lVar9 < numOfVariables;
      lVar9 = lVar9 + 1;
    } while (bVar1);
  }
  piVar3 = model;
  uVar5 = 1;
  iVar4 = numOfVariables;
  if (0 < numOfVariables) {
    do {
      uVar5 = uVar5 * 2;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if (isSat == 0) {
    uVar8 = 0xffffffff;
    uVar7 = (ulong)uVar5;
  }
  else {
    uVar7 = (ulong)(uVar5 - 1);
    next = next * 0x41c64e6d + 0x3039;
    uVar8 = (uint)((long)(ulong)((uint)(next >> 0x10) & 0x7fff) % (long)(int)(uVar5 - 1));
    if (0 < numOfVariables) {
      uVar10 = 1;
      lVar9 = 0;
      do {
        piVar3[lVar9 + 1] = -(uint)((uVar10 & uVar8) != 0) | 1;
        uVar10 = uVar10 * 2;
        lVar9 = lVar9 + 1;
      } while (lVar9 < numOfVariables);
    }
  }
  printf("p cnf %d %d\n",(ulong)(uint)numOfVariables,uVar7);
  uVar10 = 0;
  do {
    if (uVar10 != uVar8) {
      if (0 < numOfVariables) {
        uVar6 = 1;
        lVar9 = 0;
        do {
          uVar2 = -globalPermute[lVar9 + 1];
          if ((uVar6 & uVar10) != 0) {
            uVar2 = globalPermute[lVar9 + 1];
          }
          printf("%d ",(ulong)uVar2);
          uVar6 = uVar6 * 2;
          lVar9 = lVar9 + 1;
        } while (lVar9 < numOfVariables);
      }
      puts("0");
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != uVar5 + (uVar5 == 0));
  if (*stringOptions == (char *)0x0) {
    return;
  }
  printModel(*stringOptions);
  return;
}

Assistant:

void printModel (char *filename)
{
    FILE *f;
    int v, varsPerLine;

    f = fopen (filename, "w");
    if (f != NULL)
    {
        fprintf (f, "c Satisfiability model produced by sgen4\n");
        fprintf (f, "c %s\n", commandLine);
        fprintf (f, "s SATISFIABLE\n");

        varsPerLine = 20;

        for (v=1;v<=numOfVariables;v++)
        {
            if ( v % varsPerLine == 1)
                fprintf (f, "v ");
            fprintf (f, "%d ", unPermuteVar(v)*model[v]);
            if (v % varsPerLine == 0)
                fprintf (f, "\n");
        }
        if (numOfVariables % varsPerLine == 0)
            fprintf (f, "v ");
        fprintf (f, "0 \n");
        fclose (f);
    }
    else
    {
        fprintf (stderr, "Unable to write model to file <%s>\n", filename);
        exit(0);
    }

}